

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O3

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  lVar4 = N_VGetArrayPointer();
  lVar5 = N_VGetArrayPointer(y);
  lVar6 = N_VGetLength(x);
  lVar7 = N_VGetLength(y);
  if (lVar6 == lVar7) {
    if (0 < lVar6) {
      lVar7 = 0;
      iVar8 = 0;
      do {
        iVar3 = SUNRCompareTol(*(undefined8 *)(lVar4 + lVar7 * 8),*(undefined8 *)(lVar5 + lVar7 * 8)
                               ,tol);
        iVar8 = iVar8 + iVar3;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
      if (0 < iVar8) {
        puts("Check_vector failures:");
        if (0 < lVar6) {
          lVar7 = 0;
          do {
            iVar3 = SUNRCompareTol(*(undefined8 *)(lVar4 + lVar7 * 8),
                                   *(undefined8 *)(lVar5 + lVar7 * 8),tol);
            if (iVar3 != 0) {
              dVar1 = *(double *)(lVar4 + lVar7 * 8);
              dVar2 = *(double *)(lVar5 + lVar7 * 8);
              printf("  xdata[%ld] = %g != %g (err = %g)\n",dVar1,dVar2,ABS(dVar1 - dVar2),lVar7);
            }
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
          return (uint)(0 < iVar8);
        }
        goto LAB_00101b43;
      }
    }
    iVar8 = 0;
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
LAB_00101b43:
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength(x);
  yldata = N_VGetLength(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
  {
    printf("Check_vector failures:\n");
    for (i = 0; i < xldata; i++)
    {
      if (SUNRCompareTol(xdata[i], ydata[i], tol) != 0)
      {
        printf("  xdata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, xdata[i], ydata[i], SUNRabs(xdata[i] - ydata[i]));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}